

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,longdouble v)

{
  int iVar1;
  char *__s;
  LogStream *in_RDI;
  int len;
  undefined2 in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd2;
  
  iVar1 = FixedBuffer<4000>::avail
                    ((FixedBuffer<4000> *)
                     CONCAT62(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0));
  if (0x1f < iVar1) {
    __s = FixedBuffer<4000>::current(&in_RDI->buffer_);
    iVar1 = snprintf(__s,0x20,"%.12Lg");
    FixedBuffer<4000>::add(&in_RDI->buffer_,(long)iVar1);
  }
  return in_RDI;
}

Assistant:

LogStream& LogStream::operator<<(long double v){
    if(buffer_.avail() >= kMaxNumericSize){
        int len = snprintf(buffer_.current(), kMaxNumericSize, "%.12Lg", v);
        buffer_.add(len);
    }
    return *this;
}